

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_json.c
# Opt level: O1

uchar hex_value(char c)

{
  uchar uVar1;
  ushort **ppuVar2;
  undefined3 in_register_00000039;
  
  ppuVar2 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar2 + (long)CONCAT31(in_register_00000039,c) * 2 + 1) & 8) != 0) {
    return c + 0xd0;
  }
  uVar1 = '\n';
  switch(c) {
  case 'A':
    break;
  case 'B':
switchD_0013e15f_caseD_62:
    uVar1 = '\v';
    break;
  case 'C':
switchD_0013e15f_caseD_61:
    return '\f';
  case 'D':
switchD_0013e15f_caseD_61:
    return '\r';
  case 'E':
switchD_0013e15f_caseD_61:
    return '\x0e';
  case 'F':
switchD_0013e15f_caseD_61:
    return '\x0f';
  default:
    switch(c) {
    case 'a':
      break;
    case 'b':
      goto switchD_0013e15f_caseD_62;
    case 'c':
      goto switchD_0013e15f_caseD_61;
    case 'd':
      goto switchD_0013e15f_caseD_61;
    case 'e':
      goto switchD_0013e15f_caseD_61;
    case 'f':
      goto switchD_0013e15f_caseD_61;
    default:
      uVar1 = 0xff;
    }
  }
  return uVar1;
}

Assistant:

static unsigned char hex_value (json_char c)
{
   if (isdigit(c))
      return c - '0';

   switch (c) {
      case 'a': case 'A': return 0x0A;
      case 'b': case 'B': return 0x0B;
      case 'c': case 'C': return 0x0C;
      case 'd': case 'D': return 0x0D;
      case 'e': case 'E': return 0x0E;
      case 'f': case 'F': return 0x0F;
      default: return 0xFF;
   }
}